

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

int __thiscall
helics::apps::Source::addSignalGenerator(Source *this,string_view name,string_view type)

{
  pointer psVar1;
  int iVar2;
  bool bVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  int index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<helics::apps::SignalGenerator> gen;
  string_view name_local;
  
  gen.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  gen.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __y._M_str = "sine";
  __y._M_len = 4;
  bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type,__y);
  if (bVar3) {
    std::
    make_shared<helics::apps::SineGenerator,std::basic_string_view<char,std::char_traits<char>>&>
              ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    std::__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2> *)&gen,
               (__shared_ptr<helics::apps::SineGenerator,_(__gnu_cxx::_Lock_policy)2> *)&index);
  }
  else {
    __y_00._M_str = "ramp";
    __y_00._M_len = 4;
    bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type,__y_00);
    if (bVar3) {
      std::
      make_shared<helics::apps::RampGenerator,std::basic_string_view<char,std::char_traits<char>>&>
                ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      std::__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2> *)&gen,
                 (__shared_ptr<helics::apps::RampGenerator,_(__gnu_cxx::_Lock_policy)2> *)&index);
    }
    else {
      __y_01._M_str = "oscillator";
      __y_01._M_len = 10;
      bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type,__y_01);
      if (!bVar3) {
        __y_02._M_str = "phasor";
        __y_02._M_len = 6;
        bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)type,__y_02);
        if (!bVar3) goto LAB_00232459;
      }
      std::
      make_shared<helics::apps::PhasorGenerator,std::basic_string_view<char,std::char_traits<char>>&>
                ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      std::__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<helics::apps::SignalGenerator,(__gnu_cxx::_Lock_policy)2> *)&gen,
                 (__shared_ptr<helics::apps::PhasorGenerator,_(__gnu_cxx::_Lock_policy)2> *)&index);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
LAB_00232459:
  std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
  ::emplace_back<std::shared_ptr<helics::apps::SignalGenerator>>
            ((vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
              *)&this->generators,&gen);
  psVar1 = (this->generators).
           super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  index = (int)((ulong)((long)psVar1 -
                       (long)(this->generators).
                             super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
  std::
  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,int&>
            ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
              *)&this->generatorLookup,
             &(psVar1[-1].
               super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->mName,&index);
  iVar2 = index;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&gen.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar2;
}

Assistant:

int Source::addSignalGenerator(std::string_view name, std::string_view type)
    {
        std::shared_ptr<SignalGenerator> gen;
        if (type == "sine") {
            gen = std::make_shared<SineGenerator>(name);
        } else if (type == "ramp") {
            gen = std::make_shared<RampGenerator>(name);
        } else if ((type == "oscillator") || (type == "phasor")) {
            gen = std::make_shared<PhasorGenerator>(name);
        }
        generators.push_back(std::move(gen));
        auto index = static_cast<int>(generators.size() - 1);
        generatorLookup.emplace(generators.back()->getName(), index);
        return index;
    }